

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

bool __thiscall crnd::crn_unpacker::decode_color_selectors(crn_unpacker *this)

{
  vector<unsigned_int> *this_00;
  ushort uVar1;
  crn_header *pcVar2;
  uint *puVar3;
  uint *puVar4;
  bool bVar5;
  byte bVar6;
  uint32 uVar7;
  uint8 *puVar8;
  uint uVar9;
  uint32 i;
  ulong uVar10;
  uint uVar11;
  char cVar12;
  byte bVar13;
  byte bVar14;
  uint32 j;
  int iVar15;
  int iVar16;
  uint uVar17;
  bool bVar18;
  ulong local_78;
  static_huffman_data_model dm;
  
  pcVar2 = this->m_pHeader;
  bVar14 = (pcVar2->m_format).m_buf[0];
  bVar5 = true;
  if (2 < bVar14 - 0xc) {
    bVar18 = true;
    if (bVar14 - 10 < 2) goto LAB_00110df0;
    bVar5 = false;
  }
  bVar18 = bVar14 == 0xc;
LAB_00110df0:
  uVar9 = (uint)(pcVar2->m_color_selectors).m_size.m_buf[2] |
          (uint)(pcVar2->m_color_selectors).m_size.m_buf[1] << 8 |
          (uint)(pcVar2->m_color_selectors).m_size.m_buf[0] << 0x10;
  if (uVar9 != 0) {
    puVar8 = this->m_pData +
             ((ulong)(pcVar2->m_color_selectors).m_ofs.m_buf[2] |
             (ulong)((uint)(pcVar2->m_color_selectors).m_ofs.m_buf[0] << 0x10 |
                    (uint)(pcVar2->m_color_selectors).m_ofs.m_buf[1] << 8));
    (this->m_codec).m_pDecode_buf = puVar8;
    (this->m_codec).m_pDecode_buf_next = puVar8;
    (this->m_codec).m_decode_buf_size = uVar9;
    (this->m_codec).m_pDecode_buf_end = puVar8 + uVar9;
    (this->m_codec).m_bit_buf = 0;
    (this->m_codec).m_bit_count = 0;
  }
  dm.m_total_syms = 0;
  dm.m_code_sizes.m_p = (uchar *)0x0;
  dm.m_code_sizes.m_size = 0;
  dm.m_code_sizes.m_capacity = 0;
  dm.m_code_sizes.m_alloc_failed = false;
  dm.m_pDecode_tables = (decoder_tables *)0x0;
  symbol_codec::decode_receive_static_data_model(&this->m_codec,&dm);
  this_00 = &this->m_color_selectors;
  uVar1 = *(ushort *)(this->m_pHeader->m_color_selectors).m_num.m_buf;
  vector<unsigned_int>::resize(this_00,(uint)(ushort)(uVar1 << 8 | uVar1 >> 8) << bVar18);
  local_78 = 0;
  for (uVar10 = 0; uVar1 = *(ushort *)(this->m_pHeader->m_color_selectors).m_num.m_buf,
      uVar10 < (ushort)(uVar1 << 8 | uVar1 >> 8); uVar10 = uVar10 + 1) {
    for (uVar9 = 0; uVar17 = (uint)local_78, uVar9 < 0x20; uVar9 = uVar9 + 4) {
      uVar7 = symbol_codec::decode(&this->m_codec,&dm);
      local_78 = (ulong)(uVar17 ^ uVar7 << ((byte)uVar9 & 0x1f));
    }
    if (bVar5) {
      uVar17 = ~((uint)(local_78 >> 1) & 0x55555555 ^ uVar17);
      uVar9 = (uint)uVar10 * 2 + 1;
      if (bVar18 == false) {
        uVar9 = (uint)uVar10;
      }
      puVar3 = this_00->m_p;
      cVar12 = '\0';
      bVar13 = 0;
      bVar14 = 8;
      for (iVar15 = 0; iVar15 != 4; iVar15 = iVar15 + 1) {
        puVar4 = this_00->m_p;
        bVar6 = bVar13;
        for (iVar16 = 0; iVar16 != 8; iVar16 = iVar16 + 2) {
          if (bVar18 != false) {
            uVar11 = uVar17 >> (bVar6 & 0x1f);
            puVar4[uVar10 * 2] =
                 puVar4[uVar10 * 2] | ((uVar11 & 1) << 0x10 | uVar11 >> 1 & 1) << (bVar14 & 0xf);
          }
          uVar11 = uVar17 >> (cVar12 + (char)iVar16 & 0x1fU);
          puVar3[uVar9] = puVar3[uVar9] | ((uVar11 & 1) << 0x10 | uVar11 >> 1 & 1) << (bVar14 & 0xf)
          ;
          bVar14 = bVar14 + 4;
          bVar6 = bVar6 + 8;
        }
        bVar14 = bVar14 - 0xf;
        bVar13 = bVar13 + 2;
        cVar12 = cVar12 + '\b';
      }
    }
    else {
      this_00->m_p[uVar10] = uVar17 >> 1 & 0x55555555 | (uVar17 * 2 ^ uVar17) & 0xaaaaaaaa;
    }
  }
  static_huffman_data_model::~static_huffman_data_model(&dm);
  return true;
}

Assistant:

bool decode_color_selectors()
        {
            const bool has_etc_color_blocks = m_pHeader->m_format == cCRNFmtETC1 || m_pHeader->m_format == cCRNFmtETC2 || m_pHeader->m_format == cCRNFmtETC2A || m_pHeader->m_format == cCRNFmtETC1S || m_pHeader->m_format == cCRNFmtETC2AS;
            const bool has_subblocks = m_pHeader->m_format == cCRNFmtETC1 || m_pHeader->m_format == cCRNFmtETC2 || m_pHeader->m_format == cCRNFmtETC2A;
            m_codec.start_decoding(m_pData + m_pHeader->m_color_selectors.m_ofs, m_pHeader->m_color_selectors.m_size);
            static_huffman_data_model dm;
            m_codec.decode_receive_static_data_model(dm);
            m_color_selectors.resize(m_pHeader->m_color_selectors.m_num << (has_subblocks ? 1 : 0));
            for (uint32 s = 0, i = 0; i < m_pHeader->m_color_selectors.m_num; i++)
            {
                for (uint32 j = 0; j < 32; j += 4)
                    s ^= m_codec.decode(dm) << j;
                if (has_etc_color_blocks)
                {
                    for (uint32 selector = (~s & 0xAAAAAAAA) | (~(s ^ s >> 1) & 0x55555555), t = 8, h = 0; h < 4; h++, t -= 15)
                    {
                        for (uint32 w = 0; w < 4; w++, t += 4)
                        {
                            if (has_subblocks)
                            {
                                uint32 s0 = selector >> (w << 3 | h << 1);
                                m_color_selectors[i << 1] |= ((s0 >> 1 & 1) | (s0 & 1) << 16) << (t & 15);
                            }
                            uint32 s1 = selector >> (h << 3 | w << 1);
                            m_color_selectors[has_subblocks ? i << 1 | 1 : i] |= ((s1 >> 1 & 1) | (s1 & 1) << 16) << (t & 15);
                        }
                    }
                }
                else
                {
                    m_color_selectors[i] = ((s ^ s << 1) & 0xAAAAAAAA) | (s >> 1 & 0x55555555);
                }
            }
            m_codec.stop_decoding();
            return true;
        }